

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_AngleTo(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  AActor *other;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  PClass *pPVar4;
  char *pcVar5;
  undefined8 *puVar6;
  bool bVar7;
  _func_int **local_38;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      other = (AActor *)(param->field_0).field_1.a;
      if (other != (AActor *)0x0) {
        if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar4 = (other->super_DThinker).super_DObject.Class;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar1 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar1) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00435084;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          puVar6 = (undefined8 *)param[1].field_0.field_1.a;
          if (puVar6 == (undefined8 *)0x0) {
            NullParam("\"targ\"");
            puVar6 = (undefined8 *)param[1].field_0.field_1.a;
          }
          pPVar1 = AActor::RegistrationInfo.MyClass;
          if (puVar6 != (undefined8 *)0x0) {
            if (puVar6[1] == 0) {
              uVar3 = (**(code **)*puVar6)(puVar6);
              puVar6[1] = uVar3;
            }
            pPVar4 = (PClass *)puVar6[1];
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar1 && bVar7) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar7 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar1) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar7) {
              pcVar5 = "targ == NULL || targ->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_004350a3;
            }
          }
          if (numparam < 3) {
            if (defaultparam->Array[2].field_0.field_3.Type == '\0') goto LAB_00434ffe;
            pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
LAB_00434ffe:
              AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(puVar6,0));
              if (numret < 1) {
                iVar2 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != nullptr",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                ,0x1e1d,
                                "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                if (ret->RegType != '\x01') {
                  __assert_fail("RegType == REGT_FLOAT",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                ,0x144,"void VMReturn::SetFloat(double)");
                }
                *(_func_int ***)ret->Location = local_38;
                iVar2 = 1;
              }
              return iVar2;
            }
            pcVar5 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e1c,
                        "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_004350a3:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e1b,
                    "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00435084:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e1a,"int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, AngleTo)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(targ, AActor);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_FLOAT(self->AngleTo(targ, absolute).Degrees);
}